

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c++
# Opt level: O0

void __thiscall
kj::_::Debug::Context::logMessage
          (Context *this,LogSeverity severity,char *file,int line,int contextDepth,String *text)

{
  ExceptionCallback *pEVar1;
  String *pSVar2;
  undefined4 in_register_00000084;
  char *params_2;
  undefined1 local_71 [25];
  undefined1 local_58 [8];
  Value v;
  String *text_local;
  int contextDepth_local;
  int line_local;
  char *file_local;
  LogSeverity severity_local;
  Context *this_local;
  
  params_2 = (char *)CONCAT44(in_register_00000084,contextDepth);
  v.description.content.disposer = (ArrayDisposer *)text;
  if ((this->logged & 1U) == 0) {
    ensureInitialized((Value *)local_58,this);
    pEVar1 = (this->super_ExceptionCallback).next;
    pSVar2 = mv<kj::String>((String *)&v.line);
    local_71[0] = 10;
    str<char_const(&)[10],kj::String,char>
              ((String *)(local_71 + 1),(kj *)0x2913f7,(char (*) [10])pSVar2,(String *)local_71,
               params_2);
    (*pEVar1->_vptr_ExceptionCallback[4])(pEVar1,0,local_58,(ulong)(uint)v.file,0,local_71 + 1);
    String::~String((String *)(local_71 + 1));
    this->logged = true;
    Value::~Value((Value *)local_58);
  }
  pEVar1 = (this->super_ExceptionCallback).next;
  pSVar2 = mv<kj::String>((String *)v.description.content.disposer);
  (*pEVar1->_vptr_ExceptionCallback[4])
            (pEVar1,(ulong)severity,file,(ulong)(uint)line,(ulong)(contextDepth + 1),pSVar2);
  return;
}

Assistant:

void Debug::Context::logMessage(LogSeverity severity, const char* file, int line, int contextDepth,
                                String&& text) {
  if (!logged) {
    Value v = ensureInitialized();
    next.logMessage(LogSeverity::INFO, v.file, v.line, 0,
                    str("context: ", mv(v.description), '\n'));
    logged = true;
  }

  next.logMessage(severity, file, line, contextDepth + 1, mv(text));
}